

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,char *filename)

{
  double dVar1;
  int iVar2;
  int iVar3;
  REF_INT node0;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  double dVar4;
  REF_STATUS RVar5;
  uint uVar6;
  REF_DBL *scalar;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  REF_EDGE ref_edge;
  REF_DBL normdev;
  REF_DBL edge_ratio;
  REF_DBL quality;
  char *vars [4];
  REF_INT nodes [27];
  REF_EDGE local_f0;
  REF_DBL local_e8;
  char *local_e0;
  double local_d8;
  double local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  local_c8 = "q";
  local_c0 = "s";
  local_b8 = "l";
  local_b0 = "n";
  iVar10 = ref_node->max;
  if (iVar10 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x1170
           ,"ref_gather_surf_status_tec","malloc scalar of REF_DBL negative");
    uVar6 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((ulong)(uint)(iVar10 * 4) * 8);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1170,"ref_gather_surf_status_tec","malloc scalar of REF_DBL NULL");
      uVar6 = 2;
    }
    else {
      if (iVar10 != 0) {
        uVar7 = 0;
        do {
          scalar[uVar7] = 1.0;
          (scalar + uVar7)[1] = 1.0;
          uVar7 = uVar7 + 2;
        } while ((uint)(iVar10 * 4) != uVar7);
      }
      ref_cell = ref_grid->cell[3];
      local_e0 = filename;
      if (0 < ref_cell->max) {
        iVar10 = 0;
        do {
          RVar5 = ref_cell_nodes(ref_cell,iVar10,local_a8);
          if (RVar5 == 0) {
            uVar6 = ref_node_tri_quality(ref_node,local_a8,&local_d0);
            if (uVar6 != 0) {
              pcVar11 = "tri qual";
              uVar9 = 0x1173;
              goto LAB_0013dfa6;
            }
            local_e8 = 2.0;
            if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)
                ) && (uVar6 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_e8), uVar6 != 0))
            {
              pcVar11 = "norm dev";
              uVar9 = 0x1177;
              goto LAB_0013dfa6;
            }
            iVar2 = ref_cell->node_per;
            if (0 < (long)iVar2) {
              lVar8 = 0;
              do {
                iVar3 = local_a8[lVar8];
                dVar1 = scalar[(long)iVar3 * 4];
                if (local_d0 <= scalar[(long)iVar3 * 4]) {
                  dVar1 = local_d0;
                }
                scalar[(long)iVar3 * 4] = dVar1;
                uVar6 = iVar3 * 4 | 3;
                dVar1 = scalar[(int)uVar6];
                if (local_e8 <= scalar[(int)uVar6]) {
                  dVar1 = local_e8;
                }
                scalar[(int)uVar6] = dVar1;
                lVar8 = lVar8 + 1;
              } while (iVar2 != lVar8);
            }
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < ref_cell->max);
      }
      uVar6 = ref_edge_create(&local_f0,ref_grid);
      if (uVar6 == 0) {
        if (0 < local_f0->n) {
          lVar8 = 0;
          do {
            node0 = local_f0->e2n[lVar8 * 2];
            iVar10 = local_f0->e2n[lVar8 * 2 + 1];
            uVar6 = ref_node_ratio(ref_node,node0,iVar10,&local_d8);
            if (uVar6 != 0) {
              pcVar11 = "ratio";
              uVar9 = 0x1184;
              goto LAB_0013dfa6;
            }
            dVar1 = scalar[(long)node0 * 4 + 1];
            dVar4 = (scalar + (long)node0 * 4 + 1)[1];
            uVar7 = -(ulong)(dVar1 < local_d8);
            uVar12 = -(ulong)(local_d8 < dVar4);
            scalar[(long)node0 * 4 + 1] = (REF_DBL)(~uVar7 & (ulong)local_d8 | (ulong)dVar1 & uVar7)
            ;
            (scalar + (long)node0 * 4 + 1)[1] =
                 (REF_DBL)(~uVar12 & (ulong)local_d8 | (ulong)dVar4 & uVar12);
            dVar1 = scalar[(long)iVar10 * 4 + 1];
            dVar4 = (scalar + (long)iVar10 * 4 + 1)[1];
            uVar7 = -(ulong)(dVar1 < local_d8);
            uVar12 = -(ulong)(local_d8 < dVar4);
            scalar[(long)iVar10 * 4 + 1] =
                 (REF_DBL)(~uVar7 & (ulong)local_d8 | (ulong)dVar1 & uVar7);
            (scalar + (long)iVar10 * 4 + 1)[1] =
                 (REF_DBL)(~uVar12 & (ulong)local_d8 | (ulong)dVar4 & uVar12);
            lVar8 = lVar8 + 1;
          } while (lVar8 < local_f0->n);
        }
        uVar6 = ref_edge_free(local_f0);
        if (uVar6 == 0) {
          uVar6 = ref_gather_scalar_surf_tec(ref_grid,4,scalar,&local_c8,local_e0);
          if (uVar6 == 0) {
            free(scalar);
            return 0;
          }
          pcVar11 = "dump";
          uVar9 = 0x118d;
        }
        else {
          pcVar11 = "free edges";
          uVar9 = 0x118a;
        }
      }
      else {
        pcVar11 = "create edges";
        uVar9 = 0x1180;
      }
LAB_0013dfa6:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_surf_status_tec",(ulong)uVar6,pcVar11);
    }
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *scalar, quality, normdev;
  REF_INT cell, edge, node0, node1, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  const char *vars[4];
  REF_INT ldim = 4;

  vars[0] = "q";
  vars[1] = "s";
  vars[2] = "l";
  vars[3] = "n";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
    normdev = 2.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      scalar[0 + ldim * nodes[cell_node]] =
          MIN(scalar[0 + ldim * nodes[cell_node]], quality);
      scalar[3 + ldim * nodes[cell_node]] =
          MIN(scalar[3 + ldim * nodes[cell_node]], normdev);
    }
  }
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
    scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
    scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_surf_tec(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}